

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void __thiscall ast::Section::fill(Section *this,uint offset,uint8_t b,uint size)

{
  uint new_capacity;
  uint uVar1;
  
  new_capacity = size + offset;
  uVar1 = this->content_capacity;
  while (uVar1 < new_capacity) {
    enlarge(this,new_capacity);
    uVar1 = this->content_capacity;
  }
  memset(this->content + offset,(uint)b,(ulong)size);
  if (this->content_size < new_capacity) {
    this->content_size = new_capacity;
  }
  return;
}

Assistant:

void Section::fill(unsigned offset, uint8_t b, unsigned size)
{
	auto limit_superior = offset + size;
	while (limit_superior > content_capacity)
		enlarge(limit_superior);
	memset(content + offset, b, size);
	if (limit_superior > content_size)
		content_size += limit_superior - content_size;
}